

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O1

bool __thiscall
dg::vr::ValueRelations::PlainValueIterator::nextViableValue(PlainValueIterator *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  
  p_Var3 = (this->bucketIt)._M_node;
  bVar4 = (_Base_ptr)(this->valueIt)._M_current == p_Var3[1]._M_left;
  bVar5 = !bVar4;
  if (bVar4) {
    p_Var1 = (this->endIt)._M_node;
    do {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      (this->bucketIt)._M_node = p_Var3;
      if (p_Var3 == p_Var1) {
        return bVar5;
      }
      p_Var2 = p_Var3[1]._M_parent;
      (this->valueIt)._M_current = (Value **)p_Var2;
      bVar5 = p_Var2 != p_Var3[1]._M_left;
    } while (!bVar5);
  }
  return bVar5;
}

Assistant:

bool nextViableValue() {
            while (valueIt == bucketIt->second.end()) {
                if (++bucketIt == endIt)
                    return false;
                valueIt = bucketIt->second.begin();
            }
            return true;
        }